

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.hpp
# Opt level: O2

void __thiscall
jsoncons::jsonschema::
compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
compilation_context(compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *this,uri_wrapper *retrieval_uri,
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *custom_messages)

{
  initializer_list<jsoncons::jsonschema::uri_wrapper> __l;
  allocator_type local_d1;
  uri_wrapper local_d0;
  
  uri_wrapper::uri_wrapper(&this->base_uri_,retrieval_uri);
  uri_wrapper::uri_wrapper(&local_d0,retrieval_uri);
  __l._M_len = 1;
  __l._M_array = &local_d0;
  std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
  ::vector(&this->uris_,__l,&local_d1);
  uri_wrapper::~uri_wrapper(&local_d0);
  (this->id_).super__Optional_base<jsoncons::uri,_false,_false>._M_payload.
  super__Optional_payload<jsoncons::uri,_true,_false,_false>.
  super__Optional_payload_base<jsoncons::uri>._M_engaged = false;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(this->custom_messages_)._M_h,&custom_messages->_M_h);
  (this->custom_message_)._M_dataplus._M_p = (pointer)&(this->custom_message_).field_2;
  (this->custom_message_)._M_string_length = 0;
  (this->custom_message_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit compilation_context(const uri_wrapper& retrieval_uri,
            const std::unordered_map<std::string,std::string>& custom_messages = std::unordered_map<std::string,std::string>{})
            : base_uri_(retrieval_uri), 
              uris_(std::vector<uri_wrapper>{{retrieval_uri}}),
              custom_messages_{custom_messages}
        {
        }